

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O1

void D_DoomLoop(void)

{
  int iVar1;
  int iVar2;
  AActor *listenactor;
  
  r_NoInterpolate = true;
  Advisory = (FTexture *)0x0;
  Page = (FTexture *)0x0;
  if (vid_cursor.super_FBaseCVar.m_Callback != (_func_void_FBaseCVar_ptr *)0x0) {
    (*vid_cursor.super_FBaseCVar.m_Callback)(&vid_cursor.super_FBaseCVar);
  }
  iVar2 = 0;
  do {
    iVar1 = gametic;
    if (iVar2 < gametic) {
      I_StartFrame();
      iVar2 = iVar1;
    }
    if (singletics == true) {
      I_StartTic();
      D_ProcessEvents();
      G_BuildTiccmd(netcmds[consoleplayer] + maketic % 0x24);
      if (advancedemo == true) {
        D_DoAdvanceDemo();
      }
      C_Ticker();
      M_Ticker();
      G_Ticker();
      listenactor = (AActor *)(&DAT_00a39408)[(long)consoleplayer * 0x54];
      if ((listenactor != (AActor *)0x0) &&
         (((listenactor->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (&DAT_00a39408)[(long)consoleplayer * 0x54] = 0;
        listenactor = (AActor *)0x0;
      }
      S_UpdateSounds(listenactor);
      gametic = gametic + 1;
      maketic = maketic + 1;
      if (GC::Threshold <= GC::AllocBytes) {
        GC::Step();
      }
      Net_NewMakeTic();
    }
    else {
      TryRunTics();
    }
    I_StartTic();
    D_Display();
  } while (wantToRestart != true);
  wantToRestart = false;
  return;
}

Assistant:

void D_DoomLoop ()
{
	int lasttic = 0;

	// Clamp the timer to TICRATE until the playloop has been entered.
	r_NoInterpolate = true;
	Page = Advisory = NULL;

	vid_cursor.Callback();

	for (;;)
	{
		try
		{
			// frame syncronous IO operations
			if (gametic > lasttic)
			{
				lasttic = gametic;
				I_StartFrame ();
			}
			
			// process one or more tics
			if (singletics)
			{
				I_StartTic ();
				D_ProcessEvents ();
				G_BuildTiccmd (&netcmds[consoleplayer][maketic%BACKUPTICS]);
				if (advancedemo)
					D_DoAdvanceDemo ();
				C_Ticker ();
				M_Ticker ();
				G_Ticker ();
				// [RH] Use the consoleplayer's camera to update sounds
				S_UpdateSounds (players[consoleplayer].camera);	// move positional sounds
				gametic++;
				maketic++;
				GC::CheckGC ();
				Net_NewMakeTic ();
			}
			else
			{
				TryRunTics (); // will run at least one tic
			}
			// Update display, next frame, with current state.
			I_StartTic ();
			D_Display ();
			if (wantToRestart)
			{
				wantToRestart = false;
				return;
			}
		}
		catch (CRecoverableError &error)
		{
			if (error.GetMessage ())
			{
				Printf (PRINT_BOLD, "\n%s\n", error.GetMessage());
			}
			D_ErrorCleanup ();
		}
	}
}